

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::getVector(FastText *this,Vector *vec,string *word)

{
  undefined1 auVar1 [16];
  pointer piVar2;
  long lVar3;
  undefined1 in_ZMM0 [64];
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  Dictionary::getNgrams
            ((vector<int,_std::allocator<int>_> *)&local_38,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  lVar3 = -(long)local_38._M_impl.super__Vector_impl_data._M_start;
  for (piVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      piVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    Vector::addRow(vec,(this->input_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (long)*piVar2);
    lVar3 = lVar3 + -4;
  }
  if (piVar2 != local_38._M_impl.super__Vector_impl_data._M_start) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                                -((long)local_38._M_impl.super__Vector_impl_data._M_start + lVar3)
                                >> 2);
    Vector::mul(vec,(float)(1.0 / auVar1._0_8_));
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void FastText::getVector(Vector& vec, const std::string& word) {
  const std::vector<int32_t>& ngrams = dict_->getNgrams(word);
  vec.zero();
  for (auto it = ngrams.begin(); it != ngrams.end(); ++it) {
	vec.addRow(*input_, *it);
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}